

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void __thiscall DPSprite::SetState(DPSprite *this,FState *newstate,bool pending)

{
  WORD *pWVar1;
  ushort uVar2;
  APlayerPawn *self;
  uint uVar3;
  int iVar4;
  AActor *stateowner;
  uint uVar5;
  int iVar6;
  bool bVar7;
  FState *nextstate;
  FStateParamInfo stp;
  FState *local_48;
  FStateParamInfo local_40;
  
  if (this->ID == 1) {
    pWVar1 = &this->Owner->WeaponState;
    *pWVar1 = *pWVar1 & 0xf090;
  }
  this->processPending = pending;
  if (newstate != (FState *)0x0) {
    do {
      this->State = newstate;
      uVar2 = newstate->sprite;
      if (uVar2 != 1) {
        if ((newstate->field_0x22 & 2) == 0) {
          this->Frame = (uint)newstate->Frame;
        }
        if (uVar2 != 2) {
          this->Sprite = (uint)uVar2;
        }
      }
      uVar5 = (uint)newstate->Tics;
      if (newstate->TicRange == 0) {
        bVar7 = true;
      }
      else {
        uVar3 = FRandom::GenRand32(&FState::pr_statetics);
        bVar7 = newstate->TicRange == 0;
        uVar5 = uVar5 + uVar3 % (newstate->TicRange + 1);
      }
      this->Tics = uVar5;
      iVar4 = this->ID;
      if ((this->Flags & 8) == 0) {
LAB_00557b00:
        iVar6 = 1000;
        if (iVar4 != 1000) goto LAB_00557b0c;
      }
      else {
        if (iVar4 != 1 || sv_fastweapons.Value != 2) {
          if (sv_fastweapons.Value != 0) {
            uVar5 = 1;
            if (sv_fastweapons.Value == 3) {
              iVar6 = (int)newstate->Tics;
              if (!bVar7) {
                uVar5 = FRandom::GenRand32(&FState::pr_statetics);
                iVar6 = iVar6 + uVar5 % (newstate->TicRange + 1);
                iVar4 = this->ID;
              }
              uVar5 = (uint)(iVar6 != 0);
            }
            this->Tics = uVar5;
          }
          goto LAB_00557b00;
        }
        bVar7 = newstate->ActionFunc != (VMFunction *)0x0;
        uVar5 = (uint)bVar7;
        this->Tics = (uint)bVar7;
        iVar4 = 1;
LAB_00557b0c:
        if (newstate->Misc1 != 0) {
          this->x = (double)newstate->Misc1;
        }
        iVar6 = iVar4;
        if (newstate->Misc2 != 0) {
          this->y = (double)newstate->Misc2;
        }
      }
      self = this->Owner->mo;
      if (self == (APlayerPawn *)0x0) {
LAB_00557ba0:
        if (uVar5 != 0) {
          return;
        }
        newstate = this->State->NextState;
      }
      else {
        local_40.mStateType = STATE_Psprite;
        stateowner = (this->Caller).field_0.p;
        if (stateowner == (AActor *)0x0) {
LAB_00557b6a:
          stateowner = (AActor *)0x0;
        }
        else if (((stateowner->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->Caller).field_0.p = (AActor *)0x0;
          goto LAB_00557b6a;
        }
        local_40.mCallingState = newstate;
        local_40.mPSPIndex = iVar6;
        bVar7 = FState::CallAction(newstate,&self->super_AActor,stateowner,&local_40,&local_48);
        if (!bVar7) {
LAB_00557b9d:
          uVar5 = this->Tics;
          goto LAB_00557ba0;
        }
        if (((this->super_DObject).ObjectFlags & 0x20) != 0) {
          return;
        }
        if (local_48 == (FState *)0x0) {
          if (this->State != (FState *)0x0) goto LAB_00557b9d;
          break;
        }
        this->Tics = 0;
        newstate = local_48;
      }
    } while (newstate != (FState *)0x0);
  }
  (*(this->super_DObject)._vptr_DObject[4])(this);
  return;
}

Assistant:

void DPSprite::SetState(FState *newstate, bool pending)
{
	if (ID == PSP_WEAPON)
	{ // A_WeaponReady will re-set these as needed
		Owner->WeaponState &= ~(WF_WEAPONREADY | WF_WEAPONREADYALT | WF_WEAPONBOBBING | WF_WEAPONSWITCHOK | WF_WEAPONRELOADOK | WF_WEAPONZOOMOK |
								WF_USER1OK | WF_USER2OK | WF_USER3OK | WF_USER4OK);
	}

	processPending = pending;

	do
	{
		if (newstate == nullptr)
		{ // Object removed itself.
			Destroy();
			return;
		}
		State = newstate;

		if (newstate->sprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				Frame = newstate->GetFrame();
			}
			if (newstate->sprite != SPR_NOCHANGE)
			{ // okay to change sprite
				Sprite = newstate->sprite;
			}
		}

		Tics = newstate->GetTics(); // could be 0

		if (Flags & PSPF_CVARFAST)
		{
			if (sv_fastweapons == 2 && ID == PSP_WEAPON)
				Tics = newstate->ActionFunc == nullptr ? 0 : 1;
			else if (sv_fastweapons == 3)
				Tics = (newstate->GetTics() != 0);
			else if (sv_fastweapons)
				Tics = 1;		// great for producing decals :)
		}

		if (ID != PSP_FLASH)
		{ // It's still possible to set the flash layer's offsets with the action function.
			if (newstate->GetMisc1())
			{ // Set coordinates.
				x = newstate->GetMisc1();
			}
			if (newstate->GetMisc2())
			{
				y = newstate->GetMisc2();
			}
		}

		if (Owner->mo != nullptr)
		{
			FState *nextstate;
			FStateParamInfo stp = { newstate, STATE_Psprite, ID };
			if (newstate->CallAction(Owner->mo, Caller, &stp, &nextstate))
			{
				// It's possible this call resulted in this very layer being replaced.
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return;
				}
				if (nextstate != nullptr)
				{
					newstate = nextstate;
					Tics = 0;
					continue;
				}
				if (State == nullptr)
				{
					Destroy();
					return;
				}
			}
		}

		newstate = State->GetNextState();
	} while (!Tics); // An initial state of 0 could cycle through.

	return;
}